

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha1.c
# Opt level: O0

void rhash_sha1_process_block(uint *hash,uint *block)

{
  uint uVar1;
  int iVar2;
  long lVar3;
  uint local_17c;
  uint local_178;
  uint32_t E;
  uint32_t D;
  uint32_t C;
  uint32_t B;
  uint32_t A;
  uint32_t W [80];
  int local_1c;
  uint32_t temp;
  int t;
  uint *block_local;
  uint *hash_local;
  
  for (local_1c = 0; local_1c < 0x10; local_1c = local_1c + 1) {
    uVar1 = block[local_1c];
    (&B)[local_1c] = uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18
    ;
  }
  for (local_1c = 0x10; local_1c < 0x50; local_1c = local_1c + 1) {
    (&B)[local_1c] =
         ((&B)[local_1c + -3] ^ (&B)[local_1c + -8] ^ (&B)[local_1c + -0xe] ^ (&B)[local_1c + -0x10]
         ) << 1 ^ ((&B)[local_1c + -3] ^ (&B)[local_1c + -8] ^ (&B)[local_1c + -0xe] ^
                  (&B)[local_1c + -0x10]) >> 0x1f;
  }
  D = hash[1];
  E = hash[2];
  local_178 = hash[3];
  local_17c = hash[4];
  C = *hash;
  for (local_1c = 0; local_1c < 0x14; local_1c = local_1c + 1) {
    iVar2 = (C << 5 ^ C >> 0x1b) + ((E ^ local_178) & D ^ local_178) + local_17c;
    lVar3 = (long)local_1c;
    local_17c = local_178;
    local_178 = E;
    E = D << 0x1e ^ D >> 2;
    D = C;
    C = iVar2 + (&B)[lVar3] + 0x5a827999;
  }
  for (local_1c = 0x14; local_1c < 0x28; local_1c = local_1c + 1) {
    iVar2 = (C << 5 ^ C >> 0x1b) + (D ^ E ^ local_178) + local_17c;
    lVar3 = (long)local_1c;
    local_17c = local_178;
    local_178 = E;
    E = D << 0x1e ^ D >> 2;
    D = C;
    C = iVar2 + (&B)[lVar3] + 0x6ed9eba1;
  }
  for (local_1c = 0x28; local_1c < 0x3c; local_1c = local_1c + 1) {
    iVar2 = (C << 5 ^ C >> 0x1b) + (D & (E | local_178) | E & local_178) + local_17c;
    lVar3 = (long)local_1c;
    local_17c = local_178;
    local_178 = E;
    E = D << 0x1e ^ D >> 2;
    D = C;
    C = iVar2 + (&B)[lVar3] + 0x8f1bbcdc;
  }
  for (local_1c = 0x3c; local_1c < 0x50; local_1c = local_1c + 1) {
    iVar2 = (C << 5 ^ C >> 0x1b) + (D ^ E ^ local_178) + local_17c;
    lVar3 = (long)local_1c;
    local_17c = local_178;
    local_178 = E;
    E = D << 0x1e ^ D >> 2;
    D = C;
    C = iVar2 + (&B)[lVar3] + 0xca62c1d6;
  }
  *hash = C + *hash;
  hash[1] = D + hash[1];
  hash[2] = E + hash[2];
  hash[3] = local_178 + hash[3];
  hash[4] = local_17c + hash[4];
  return;
}

Assistant:

static void rhash_sha1_process_block(unsigned* hash, const unsigned* block)
{
	int           t;                 /* Loop counter */
	uint32_t      temp;              /* Temporary word value */
	uint32_t      W[80];             /* Word sequence */
	uint32_t      A, B, C, D, E;     /* Word buffers */

	/* initialize the first 16 words in the array W */
	for (t = 0; t < 16; t++) {
		/* note: it is much faster to apply be2me here, then using be32_copy */
		W[t] = be2me_32(block[t]);
	}

	/* initialize the rest */
	for (t = 16; t < 80; t++) {
		W[t] = ROTL32(W[t - 3] ^ W[t - 8] ^ W[t - 14] ^ W[t - 16], 1);
	}

	A = hash[0];
	B = hash[1];
	C = hash[2];
	D = hash[3];
	E = hash[4];

	for (t = 0; t < 20; t++) {
		/* the following is faster than ((B & C) | ((~B) & D)) */
		temp =  ROTL32(A, 5) + (((C ^ D) & B) ^ D)
			+ E + W[t] + 0x5A827999;
		E = D;
		D = C;
		C = ROTL32(B, 30);
		B = A;
		A = temp;
	}

	for (t = 20; t < 40; t++) {
		temp = ROTL32(A, 5) + (B ^ C ^ D) + E + W[t] + 0x6ED9EBA1;
		E = D;
		D = C;
		C = ROTL32(B, 30);
		B = A;
		A = temp;
	}

	for (t = 40; t < 60; t++) {
		temp = ROTL32(A, 5) + ((B & C) | (B & D) | (C & D))
			+ E + W[t] + 0x8F1BBCDC;
		E = D;
		D = C;
		C = ROTL32(B, 30);
		B = A;
		A = temp;
	}

	for (t = 60; t < 80; t++) {
		temp = ROTL32(A, 5) + (B ^ C ^ D) + E + W[t] + 0xCA62C1D6;
		E = D;
		D = C;
		C = ROTL32(B, 30);
		B = A;
		A = temp;
	}

	hash[0] += A;
	hash[1] += B;
	hash[2] += C;
	hash[3] += D;
	hash[4] += E;
}